

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O0

size_t mi_bin(size_t size)

{
  size_t sVar1;
  size_t sVar2;
  size_t in_RDI;
  size_t bin;
  size_t b;
  size_t wsize;
  undefined8 local_30;
  undefined8 local_8;
  
  sVar1 = _mi_wsize_from_size(in_RDI);
  if (sVar1 < 9) {
    if (sVar1 < 2) {
      local_30 = 1;
    }
    else {
      local_30 = sVar1 + 1 & 0xfffffffffffffffe;
    }
    local_8 = local_30;
  }
  else if (sVar1 < 0x2001) {
    sVar2 = mi_clz(sVar1 - 1);
    local_8 = ((0x3f - sVar2) * 4 + (sVar1 - 1 >> ((char)(0x3f - sVar2) - 2U & 0x3f) & 3)) - 3;
  }
  else {
    local_8 = 0x49;
  }
  return local_8;
}

Assistant:

static inline size_t mi_bin(size_t size) {
  size_t wsize = _mi_wsize_from_size(size);
#if defined(MI_ALIGN4W)
  if mi_likely(wsize <= 4) {
    return (wsize <= 1 ? 1 : (wsize+1)&~1); // round to double word sizes
  }
#elif defined(MI_ALIGN2W)
  if mi_likely(wsize <= 8) {
    return (wsize <= 1 ? 1 : (wsize+1)&~1); // round to double word sizes
  }
#else
  if mi_likely(wsize <= 8) {
    return (wsize == 0 ? 1 : wsize);
  }
#endif
  else if mi_unlikely(wsize > MI_MEDIUM_OBJ_WSIZE_MAX) {
    return MI_BIN_HUGE;
  }
  else {
    #if defined(MI_ALIGN4W)
    if (wsize <= 16) { wsize = (wsize+3)&~3; } // round to 4x word sizes
    #endif
    wsize--;
    // find the highest bit
    const size_t b = (MI_SIZE_BITS - 1 - mi_clz(wsize));  // note: wsize != 0
    // and use the top 3 bits to determine the bin (~12.5% worst internal fragmentation).
    // - adjust with 3 because we use do not round the first 8 sizes
    //   which each get an exact bin
    const size_t bin = ((b << 2) + ((wsize >> (b - 2)) & 0x03)) - 3;
    mi_assert_internal(bin > 0 && bin < MI_BIN_HUGE);
    return bin;
  }
}